

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.pb.cc
# Opt level: O1

void __thiscall google::protobuf::UninterpretedOption::Clear(UninterpretedOption *this)

{
  void **ppvVar1;
  uint uVar2;
  Rep *pRVar3;
  string *psVar4;
  long lVar5;
  long lVar6;
  
  lVar6 = (long)(this->name_).super_RepeatedPtrFieldBase.current_size_;
  if (0 < lVar6) {
    pRVar3 = (this->name_).super_RepeatedPtrFieldBase.rep_;
    lVar5 = 0;
    do {
      ppvVar1 = pRVar3->elements + lVar5;
      lVar5 = lVar5 + 1;
      UninterpretedOption_NamePart::Clear((UninterpretedOption_NamePart *)*ppvVar1);
    } while (lVar6 != lVar5);
    (this->name_).super_RepeatedPtrFieldBase.current_size_ = 0;
  }
  uVar2 = (this->_has_bits_).has_bits_[0];
  if ((uVar2 & 7) != 0) {
    if ((uVar2 & 1) != 0) {
      psVar4 = (this->identifier_value_).ptr_;
      psVar4->_M_string_length = 0;
      *(psVar4->_M_dataplus)._M_p = '\0';
    }
    if ((uVar2 & 2) != 0) {
      psVar4 = (this->string_value_).ptr_;
      psVar4->_M_string_length = 0;
      *(psVar4->_M_dataplus)._M_p = '\0';
    }
    if ((uVar2 & 4) != 0) {
      psVar4 = (this->aggregate_value_).ptr_;
      psVar4->_M_string_length = 0;
      *(psVar4->_M_dataplus)._M_p = '\0';
    }
  }
  if ((uVar2 & 0x38) != 0) {
    this->positive_int_value_ = 0;
    this->negative_int_value_ = 0;
    this->double_value_ = 0.0;
  }
  (this->_has_bits_).has_bits_[0] = 0;
  if (((ulong)(this->_internal_metadata_).
              super_InternalMetadataWithArenaBase<google::protobuf::UnknownFieldSet,_google::protobuf::internal::InternalMetadataWithArena>
              .ptr_ & 1) == 0) {
    return;
  }
  internal::InternalMetadataWithArena::DoClear(&this->_internal_metadata_);
  return;
}

Assistant:

void UninterpretedOption::Clear() {
// @@protoc_insertion_point(message_clear_start:google.protobuf.UninterpretedOption)
  ::PROTOBUF_NAMESPACE_ID::uint32 cached_has_bits = 0;
  // Prevent compiler warnings about cached_has_bits being unused
  (void) cached_has_bits;

  name_.Clear();
  cached_has_bits = _has_bits_[0];
  if (cached_has_bits & 0x00000007u) {
    if (cached_has_bits & 0x00000001u) {
      identifier_value_.ClearNonDefaultToEmpty();
    }
    if (cached_has_bits & 0x00000002u) {
      string_value_.ClearNonDefaultToEmpty();
    }
    if (cached_has_bits & 0x00000004u) {
      aggregate_value_.ClearNonDefaultToEmpty();
    }
  }
  if (cached_has_bits & 0x00000038u) {
    ::memset(&positive_int_value_, 0, static_cast<size_t>(
        reinterpret_cast<char*>(&double_value_) -
        reinterpret_cast<char*>(&positive_int_value_)) + sizeof(double_value_));
  }
  _has_bits_.Clear();
  _internal_metadata_.Clear();
}